

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeObj(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int i,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *newVal,bool scale)

{
  SPxSense SVar1;
  undefined1 in_CL;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  uint in_ESI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  undefined4 uVar2;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  (*(in_RDI->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x27])(in_RDI,(ulong)in_ESI,in_RDX,(ulong)(byte)(uVar3 >> 0x18));
  SVar1 = spxSense(in_RDI);
  if (SVar1 == MINIMIZE) {
    uVar2 = 0xffffffff;
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxObj_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(uVar3,0xffffffff),(int)((ulong)in_RDI >> 0x20));
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator*=(in_RDX,(int *)CONCAT44(uVar3,uVar2));
  }
  return;
}

Assistant:

virtual void changeObj(int i, const R& newVal, bool scale = false)
   {
      changeMaxObj(i, newVal, scale);

      if(spxSense() == MINIMIZE)
         LPColSetBase<R>::maxObj_w(i) *= -1;
   }